

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::InternReadFile
          (AssbinImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  unsigned_short uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  IOStream *pIVar5;
  DeadlyImportError *pDVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined1 local_140 [8];
  MemoryIOStream io;
  string local_110;
  int local_ec;
  uint8_t *puStack_e8;
  int res;
  uchar *uncompressedData;
  size_t len;
  uchar *compressedData;
  uLongf compressedSize;
  uLongf uncompressedSize;
  string local_b8;
  undefined1 local_92;
  allocator<char> local_91;
  string local_90;
  uint local_6c;
  uint local_68;
  uint versionMinor;
  uint versionMajor;
  allocator<char> local_51;
  string local_50;
  IOStream *local_30;
  IOStream *stream;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  AssbinImporter *this_local;
  
  stream = (IOStream *)pIOHandler;
  pIOHandler_local = (IOSystem *)pScene;
  pScene_local = (aiScene *)pFile;
  pFile_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  pIVar5 = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if (pIVar5 != (IOStream *)0x0) {
    local_30 = pIVar5;
    (*pIVar5->_vptr_IOStream[4])(pIVar5,0x2c,1);
    local_68 = Read<unsigned_int>(local_30);
    local_6c = Read<unsigned_int>(local_30);
    if ((local_6c != 0) || (local_68 != 1)) {
      local_92 = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"Invalid version, data format not compatible!",&local_91);
      DeadlyImportError::DeadlyImportError(pDVar6,&local_90);
      local_92 = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    Read<unsigned_int>(local_30);
    Read<unsigned_int>(local_30);
    uVar1 = Read<unsigned_short>(local_30);
    this->shortened = uVar1 != 0;
    uVar1 = Read<unsigned_short>(local_30);
    this->compressed = uVar1 != 0;
    if ((this->shortened & 1U) != 0) {
      uncompressedSize._6_1_ = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Shortened binaries are not supported!",
                 (allocator<char> *)((long)&uncompressedSize + 7));
      DeadlyImportError::DeadlyImportError(pDVar6,&local_b8);
      uncompressedSize._6_1_ = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    (*local_30->_vptr_IOStream[4])(local_30,0x100,1);
    (*local_30->_vptr_IOStream[4])(local_30,0x80,1);
    (*local_30->_vptr_IOStream[4])(local_30,0x40,1);
    if ((this->compressed & 1U) == 0) {
      ReadBinaryScene(this,local_30,(aiScene *)pIOHandler_local);
    }
    else {
      uVar2 = Read<unsigned_int>(local_30);
      compressedSize = (uLongf)uVar2;
      iVar3 = (*local_30->_vptr_IOStream[6])();
      iVar4 = (*local_30->_vptr_IOStream[5])();
      compressedData = (uchar *)(CONCAT44(extraout_var,iVar3) - CONCAT44(extraout_var_00,iVar4));
      len = (size_t)operator_new__((ulong)compressedData);
      iVar3 = (*local_30->_vptr_IOStream[2])(local_30,len,1,compressedData);
      uncompressedData = (uchar *)CONCAT44(extraout_var_01,iVar3);
      if (uncompressedData != compressedData) {
        __assert_fail("len == compressedSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                      ,0x2c3,
                      "virtual void Assimp::AssbinImporter::InternReadFile(const std::string &, aiScene *, IOSystem *)"
                     );
      }
      puStack_e8 = (uint8_t *)operator_new__(compressedSize);
      local_ec = uncompress(puStack_e8,&compressedSize,len);
      if (local_ec != 0) {
        if (puStack_e8 != (uint8_t *)0x0) {
          operator_delete__(puStack_e8);
        }
        if (len != 0) {
          operator_delete__((void *)len);
        }
        (*stream->_vptr_IOStream[5])(stream,local_30);
        io._38_1_ = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"Zlib decompression failed.",
                   (allocator<char> *)&io.field_0x27);
        DeadlyImportError::DeadlyImportError(pDVar6,&local_110);
        io._38_1_ = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      MemoryIOStream::MemoryIOStream((MemoryIOStream *)local_140,puStack_e8,compressedSize,false);
      ReadBinaryScene(this,(IOStream *)local_140,(aiScene *)pIOHandler_local);
      if (puStack_e8 != (uint8_t *)0x0) {
        operator_delete__(puStack_e8);
      }
      if (len != 0) {
        operator_delete__((void *)len);
      }
      MemoryIOStream::~MemoryIOStream((MemoryIOStream *)local_140);
    }
    (*stream->_vptr_IOStream[5])(stream,local_30);
  }
  return;
}

Assistant:

void AssbinImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler ) {
    IOStream * stream = pIOHandler->Open(pFile,"rb");
    if (nullptr == stream) {
        return;
    }

    // signature
    stream->Seek( 44, aiOrigin_CUR );

    unsigned int versionMajor = Read<unsigned int>(stream);
    unsigned int versionMinor = Read<unsigned int>(stream);
    if (versionMinor != ASSBIN_VERSION_MINOR || versionMajor != ASSBIN_VERSION_MAJOR) {
        throw DeadlyImportError( "Invalid version, data format not compatible!" );
    }

    /*unsigned int versionRevision =*/ Read<unsigned int>(stream);
    /*unsigned int compileFlags =*/ Read<unsigned int>(stream);

    shortened = Read<uint16_t>(stream) > 0;
    compressed = Read<uint16_t>(stream) > 0;

    if (shortened)
        throw DeadlyImportError( "Shortened binaries are not supported!" );

    stream->Seek( 256, aiOrigin_CUR ); // original filename
    stream->Seek( 128, aiOrigin_CUR ); // options
    stream->Seek( 64, aiOrigin_CUR ); // padding

    if (compressed) {
        uLongf uncompressedSize = Read<uint32_t>(stream);
        uLongf compressedSize = static_cast<uLongf>(stream->FileSize() - stream->Tell());

        unsigned char * compressedData = new unsigned char[ compressedSize ];
        size_t len = stream->Read( compressedData, 1, compressedSize );
        ai_assert(len == compressedSize);

        unsigned char * uncompressedData = new unsigned char[ uncompressedSize ];

        int res = uncompress( uncompressedData, &uncompressedSize, compressedData, (uLong) len );
        if(res != Z_OK)
        {
            delete [] uncompressedData;
            delete [] compressedData;
            pIOHandler->Close(stream);
            throw DeadlyImportError("Zlib decompression failed.");
        }

        MemoryIOStream io( uncompressedData, uncompressedSize );

        ReadBinaryScene(&io,pScene);

        delete[] uncompressedData;
        delete[] compressedData;
    } else {
        ReadBinaryScene(stream,pScene);
    }

    pIOHandler->Close(stream);
}